

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParserNsPop(xmlParserCtxtPtr ctxt,int nr)

{
  xmlParserNsExtra *pxVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  xmlParserNsBucket *bucket;
  xmlHashedString hprefix;
  xmlParserNsBucket *local_48;
  xmlHashedString local_40;
  
  lVar3 = (long)ctxt->nsNr;
  lVar2 = lVar3 - nr;
  lVar4 = lVar3 << 4;
  lVar5 = lVar3 * 0x18 + -4;
  for (; lVar4 = lVar4 + -0x10, lVar2 < lVar3; lVar3 = lVar3 + -1) {
    local_40.name = *(xmlChar **)((long)ctxt->nsTab + lVar4);
    pxVar1 = ctxt->nsdb->extra;
    if (local_40.name == (xmlChar *)0x0) {
      ctxt->nsdb->defaultNsIndex = *(int *)((long)&pxVar1->saxData + lVar5);
    }
    else {
      local_48 = (xmlParserNsBucket *)0x0;
      local_40.hashValue = *(uint *)((long)pxVar1 + lVar5 + -0xc);
      xmlParserNsLookup(ctxt,&local_40,&local_48);
      local_48->index = *(int *)((long)&pxVar1->saxData + lVar5);
    }
    lVar5 = lVar5 + -0x18;
  }
  ctxt->nsNr = (int)lVar2;
  return nr;
}

Assistant:

static int
xmlParserNsPop(xmlParserCtxtPtr ctxt, int nr)
{
    int i;

    /* assert(nr <= ctxt->nsNr); */

    for (i = ctxt->nsNr - 1; i >= ctxt->nsNr - nr; i--) {
        const xmlChar *prefix = ctxt->nsTab[i * 2];
        xmlParserNsExtra *extra = &ctxt->nsdb->extra[i];

        if (prefix == NULL) {
            ctxt->nsdb->defaultNsIndex = extra->oldIndex;
        } else {
            xmlHashedString hprefix;
            xmlParserNsBucket *bucket = NULL;

            hprefix.name = prefix;
            hprefix.hashValue = extra->prefixHashValue;
            xmlParserNsLookup(ctxt, &hprefix, &bucket);
            /* assert(bucket && bucket->hashValue); */
            bucket->index = extra->oldIndex;
        }
    }

    ctxt->nsNr -= nr;
    return(nr);
}